

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void Assimp::FBX::ResolveVertexDataArray<aiColor4t<float>>
               (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *data_out,Scope *source
               ,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  pointer paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer paVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Scope *pSVar11;
  char *pcVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  Element *pEVar16;
  long lVar17;
  pointer piVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  _Alloc_hider _Var23;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator local_24a;
  allocator local_249;
  string local_248;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  Scope *local_1e8;
  char *local_1e0;
  char *local_1d8;
  string *local_1d0;
  undefined1 local_1c8 [376];
  string local_50;
  
  local_1e0 = dataElementName;
  iVar14 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1d0 = ReferenceInformationType;
  iVar15 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1e8 = source;
  local_1d8 = indexDataElementName;
  if (iVar15 == 0) {
    std::__cxx11::string::string((string *)&local_50,indexDataElementName,&local_249);
    bVar13 = HasElement(source,&local_50);
    bVar13 = !bVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    bVar13 = false;
  }
  bVar7 = (bool)(iVar14 == 0 | bVar13);
  iVar14 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar12 = local_1e0;
  if ((bVar7) && (iVar14 == 0)) {
    std::__cxx11::string::string((string *)local_1c8,local_1e0,(allocator *)&local_248);
    pSVar11 = local_1e8;
    bVar13 = HasElement(local_1e8,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if (!bVar13) {
      return;
    }
    local_248._M_dataplus._M_p = (pointer)0x0;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)local_1c8,pcVar12,(allocator *)&local_228);
    pEVar16 = GetRequiredElement(pSVar11,(string *)local_1c8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_248,pEVar16);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(data_out,vertex_count)
    ;
    _Var23._M_p = local_248._M_dataplus._M_p;
    if (local_248._M_string_length - (long)local_248._M_dataplus._M_p != 0) {
      lVar17 = (long)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) >> 4;
      lVar19 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar19];
        uVar20 = (ulong)uVar2;
        uVar21 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar19] + uVar2;
        if (uVar2 < uVar21) {
          do {
            uVar4 = *(undefined8 *)(local_248._M_dataplus._M_p + lVar19 * 0x10);
            uVar5 = *(undefined8 *)(local_248._M_dataplus._M_p + lVar19 * 0x10 + 8);
            paVar3 = (data_out->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start +
                     (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar20];
            paVar3->r = (float)(int)uVar4;
            paVar3->g = (float)(int)((ulong)uVar4 >> 0x20);
            paVar3->b = (float)(int)uVar5;
            paVar3->a = (float)(int)((ulong)uVar5 >> 0x20);
            uVar20 = uVar20 + 1;
          } while (uVar21 != uVar20);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar17 + (ulong)(lVar17 == 0));
    }
  }
  else {
    iVar14 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((iVar15 != 0 || bVar13) || (iVar14 != 0)) {
      iVar14 = std::__cxx11::string::compare((char *)MappingInformationType);
      pcVar12 = local_1e0;
      pSVar11 = local_1e8;
      if (bVar7 && iVar14 == 0) {
        local_248._M_dataplus._M_p = (pointer)0x0;
        local_248._M_string_length = 0;
        local_248.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string((string *)local_1c8,local_1e0,(allocator *)&local_228);
        pEVar16 = GetRequiredElement(pSVar11,(string *)local_1c8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_248,
                   pEVar16);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_);
        }
        if ((long)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) >> 4 ==
            vertex_count) {
          _Var23._M_p = (pointer)(data_out->
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
          paVar6 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          paVar3 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_248._M_dataplus._M_p;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_248._M_string_length;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_248.field_2._M_allocated_capacity;
          local_248._M_dataplus._M_p = _Var23._M_p;
          local_248._M_string_length = (size_type)paVar6;
          local_248.field_2._M_allocated_capacity = (size_type)paVar3;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1c8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
          _Var23._M_p = local_248._M_dataplus._M_p;
        }
        goto LAB_0060fd51;
      }
      iVar14 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((iVar15 != 0 || bVar13) || iVar14 != 0) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,(local_1d0->_M_dataplus)._M_p,local_1d0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
        return;
      }
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1c8,pcVar12,(allocator *)&local_248);
      pEVar16 = GetRequiredElement(pSVar11,(string *)local_1c8,(Element *)0x0);
      pcVar12 = local_1d8;
      ParseVectorDataArray(&local_228,pEVar16);
      pcVar1 = local_1c8 + 0x10;
      if ((pointer)local_1c8._0_8_ != pcVar1) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1c8,pcVar12,(allocator *)&local_248);
      pEVar16 = GetRequiredElement(pSVar11,(string *)local_1c8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar16);
      if ((pointer)local_1c8._0_8_ != pcVar1) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar20 = 0;
          piVar18 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar22 = (ulong)*piVar18;
            if (uVar22 == 0xffffffffffffffff) {
              paVar3 = (data_out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar20;
              paVar3->r = 0.0;
              paVar3->g = 0.0;
              paVar3->b = 0.0;
              paVar3->a = 0.0;
            }
            else {
              if ((ulong)((long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar22) {
                local_1c8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"index out of range","");
                std::__cxx11::string::string((string *)&local_248,pcVar12,&local_24a);
                pEVar16 = GetRequiredElement(pSVar11,&local_248,(Element *)0x0);
                Util::DOMError((string *)local_1c8,pEVar16);
              }
              paVar3 = local_228.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar22;
              fVar8 = paVar3->g;
              fVar9 = paVar3->b;
              fVar10 = paVar3->a;
              paVar6 = (data_out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar20;
              paVar6->r = paVar3->r;
              paVar6->g = fVar8;
              paVar6->b = fVar9;
              paVar6->a = fVar10;
            }
            uVar20 = (ulong)((int)uVar20 + 1);
            piVar18 = piVar18 + 1;
          } while (piVar18 !=
                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x60fd79);
      }
    }
    else {
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1c8,local_1e0,(allocator *)&local_248);
      pSVar11 = local_1e8;
      pEVar16 = GetRequiredElement(local_1e8,(string *)local_1c8,(Element *)0x0);
      pcVar12 = local_1d8;
      ParseVectorDataArray(&local_228,pEVar16);
      pcVar1 = local_1c8 + 0x10;
      if ((pointer)local_1c8._0_8_ != pcVar1) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1c8,pcVar12,(allocator *)&local_248);
      pEVar16 = GetRequiredElement(pSVar11,(string *)local_1c8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar16);
      if ((pointer)local_1c8._0_8_ != pcVar1) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar17 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar19 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar19];
          uVar20 = (ulong)uVar2;
          uVar21 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar19] + uVar2;
          if (uVar2 < uVar21) {
            do {
              if ((ulong)((long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                  (ulong)(long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar19]) {
                local_1c8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"index out of range","");
                std::__cxx11::string::string((string *)&local_248,pcVar12,&local_24a);
                pEVar16 = GetRequiredElement(pSVar11,&local_248,(Element *)0x0);
                Util::DOMError((string *)local_1c8,pEVar16);
              }
              paVar3 = local_228.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start +
                       local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar19];
              fVar8 = paVar3->g;
              fVar9 = paVar3->b;
              fVar10 = paVar3->a;
              paVar6 = (data_out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start +
                       (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar20];
              paVar6->r = paVar3->r;
              paVar6->g = fVar8;
              paVar6->b = fVar9;
              paVar6->a = fVar10;
              uVar20 = uVar20 + 1;
            } while (uVar21 != uVar20);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != lVar17 + (ulong)(lVar17 == 0));
      }
    }
    _Var23._M_p = (pointer)local_228.
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start;
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      _Var23._M_p = (pointer)local_228.
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
    }
  }
LAB_0060fd51:
  if ((pointer)_Var23._M_p != (pointer)0x0) {
    operator_delete(_Var23._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}